

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLDeclaration * __thiscall tinyxml2::XMLDocument::NewDeclaration(XMLDocument *this,char *str)

{
  int iVar1;
  undefined4 extraout_var;
  char *str_00;
  XMLNode *this_00;
  
  iVar1 = (*(this->_commentPool).super_MemPool._vptr_MemPool[3])(&this->_commentPool);
  this_00 = (XMLNode *)CONCAT44(extraout_var,iVar1);
  XMLDeclaration::XMLDeclaration((XMLDeclaration *)this_00,this);
  this_00->_memPool = &(this->_commentPool).super_MemPool;
  DynArray<tinyxml2::XMLNode_*,_10>::EnsureCapacity(&this->_unlinked,(this->_unlinked)._size + 1);
  iVar1 = (this->_unlinked)._size;
  (this->_unlinked)._mem[iVar1] = this_00;
  (this->_unlinked)._size = iVar1 + 1;
  str_00 = "xml version=\"1.0\" encoding=\"UTF-8\"";
  if (str != (char *)0x0) {
    str_00 = str;
  }
  StrPair::SetStr(&this_00->_value,str_00,0);
  return (XMLDeclaration *)this_00;
}

Assistant:

XMLDeclaration* XMLDocument::NewDeclaration( const char* str )
{
    XMLDeclaration* dec = CreateUnlinkedNode<XMLDeclaration>( _commentPool );
    dec->SetValue( str ? str : "xml version=\"1.0\" encoding=\"UTF-8\"" );
    return dec;
}